

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateSlice(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Range)

{
  int nSize;
  int iVar1;
  Cba_Man_t *pCVar2;
  uint x;
  uint uVar3;
  char *format;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  
  if (iFon < 1) {
    __assert_fail("Cba_FonIsReal(iFon)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x596,"int Prs_CreateSlice(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
  }
  format = Cba_ManGetSliceName(p,iFon,Range);
  x = Cba_NtkNewStrId(p,format);
  pCVar2 = p->pDesign;
  nSize = x + 1;
  Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill);
  if ((-1 < (int)x) && ((int)x < (pCVar2->vNameMap).nSize)) {
    iVar1 = (pCVar2->vNameMap).pArray[x];
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar3 = Cba_ObjAlloc(p,CBA_BOX_SLICE,1,1);
    Cba_ObjSetName(p,uVar3,x);
    Cba_ObjSetFinFon(p,uVar3,0,iFon);
    if ((int)uVar3 < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
    }
    if ((int)uVar3 < (p->vObjFon0).nSize) {
      if ((p->vFonRange).nSize < 1) {
        __assert_fail("Cba_NtkHasFonRanges(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
      }
      if (Range < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar3 = (p->vObjFon0).pArray[uVar3];
      Vec_IntFillExtra(&p->vFonRange,uVar3 + 1,Fill_00);
      if ((-1 < (int)uVar3) && ((int)uVar3 < (p->vFonRange).nSize)) {
        (p->vFonRange).pArray[uVar3] = Range * 2;
        Cba_FonSetName(p,uVar3,x);
        pCVar2 = p->pDesign;
        Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill_01);
        if ((pCVar2->vNameMap).nSize <= (int)x) goto LAB_003e1ac8;
        if ((pCVar2->vNameMap).pArray[x] != 0) {
          __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
        }
        Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill_02);
        if ((int)x < (pCVar2->vNameMap).nSize) {
          (pCVar2->vNameMap).pArray[x] = uVar3;
          Vec_IntPush(&pCVar2->vUsed,x);
          return uVar3;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_003e1ac8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateSlice( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Range )
{
    int iObj, iFonNew, NameId;
    assert( Cba_FonIsReal(iFon) );
    // check existing slice
    NameId = Cba_NtkNewStrId( p, Cba_ManGetSliceName(p, iFon, Range) );
    iFonNew = Cba_NtkGetMap( p, NameId );
    if ( iFonNew )
        return iFonNew;
    // create slice
    iObj = Cba_ObjAlloc( p, CBA_BOX_SLICE, 1, 1 );
    Cba_ObjSetName( p, iObj, NameId );
    Cba_ObjSetFinFon( p, iObj, 0, iFon );
    iFonNew = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFonNew, Range );
    Cba_FonSetName( p, iFonNew, NameId );
    Cba_NtkSetMap( p, NameId, iFonNew );
    return iFonNew;        
}